

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.h
# Opt level: O0

void test_dsStack_store(void)

{
  int iVar1;
  uint uVar2;
  char *pcStack_38;
  DS_STATUS res;
  void *data;
  char *pcStack_28;
  int i;
  char *strs [3];
  
  iVar1 = ds_stack_counts(stack);
  UnityAssertEqualNumber((long)iVar1,0,"unexpected counts!",0x3b,UNITY_DISPLAY_STYLE_INT);
  pcStack_28 = "one";
  strs[0] = "two";
  strs[1] = "three";
  for (data._4_4_ = 0; data._4_4_ < 3; data._4_4_ = data._4_4_ + 1) {
    ds_stack_push(stack,*(undefined8 *)((long)&stack0xffffffffffffffd8 + (long)data._4_4_ * 8));
  }
  uVar2 = ds_stack_pop(stack,&stack0xffffffffffffffc8);
  UnityAssertEqualNumber((ulong)uVar2,0,(char *)0x0,0x41,UNITY_DISPLAY_STYLE_INT);
  iVar1 = strcmp(pcStack_38,"three");
  if (iVar1 != 0) {
    UnityFail(" Expected TRUE Was FALSE",0x42);
  }
  uVar2 = ds_stack_clear(stack);
  UnityAssertEqualNumber((ulong)uVar2,0,(char *)0x0,0x44,UNITY_DISPLAY_STYLE_INT);
  iVar1 = ds_stack_counts(stack);
  UnityAssertEqualNumber((long)iVar1,0,"unexpected counts!",0x45,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

UNITY_WEAK_ATTRIBUTE void setUp(void) { }